

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall t_php_generator::init_generator(t_php_generator *this)

{
  string *__lhs;
  ofstream_with_content_based_conditional_update *this_00;
  t_php_generator *this_01;
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  int __oflag;
  pointer __rhs;
  string f_types_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  t_php_generator *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  NSx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&f_types_name,this);
  iVar1 = mkdir(f_types_name._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&f_types_name);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_50,this);
      std::__cxx11::string::string((string *)&local_98,local_50._M_dataplus._M_p,(allocator *)&NSx);
      std::operator+(&f_types_name,&local_98,": ");
      pcVar4 = strerror(*piVar2);
      std::operator+(pbVar3,&f_types_name,pcVar4);
      __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  php_namespace_suffix_abi_cxx11_
            (&f_types_name,this,(this->super_t_oop_generator).super_t_generator.program_);
  split(&NSx,this,&f_types_name,'\\');
  std::__cxx11::string::~string((string *)&f_types_name);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&f_types_name,this);
  __lhs = &this->package_dir_;
  local_78 = this;
  std::__cxx11::string::operator=((string *)__lhs,(string *)&f_types_name);
  std::__cxx11::string::~string((string *)&f_types_name);
  local_70 = NSx.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __rhs = NSx.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__rhs == local_70) {
      if (local_78->classmap_ != false) {
        std::operator+(&f_types_name,__lhs,"Types.php");
        std::__cxx11::string::string
                  ((string *)&local_98,f_types_name._M_dataplus._M_p,(allocator *)&local_50);
        this_01 = local_78;
        this_00 = &local_78->f_types_;
        template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
                  (this_00,(char *)&local_98,__oflag);
        std::__cxx11::string::~string((string *)&local_98);
        generate_program_header(this_01,(ostream *)this_00);
        std::__cxx11::string::~string((string *)&f_types_name);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&NSx);
      return;
    }
    std::operator+(&local_50,__lhs,"/");
    std::operator+(&local_98,&local_50,__rhs);
    std::operator+(&f_types_name,&local_98,"/");
    std::__cxx11::string::operator=((string *)__lhs,(string *)&f_types_name);
    std::__cxx11::string::~string((string *)&f_types_name);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = mkdir((__lhs->_M_dataplus)._M_p,0x1ff);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x11) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&local_98,(__lhs->_M_dataplus)._M_p,(allocator *)&local_50);
        std::operator+(&f_types_name,&local_98,": ");
        pcVar4 = strerror(*piVar2);
        std::operator+(pbVar3,&f_types_name,pcVar4);
        __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

void t_php_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  // Create Real directory Namespaces
  vector<string> NSx = split(php_namespace_suffix(get_program()), '\\');
  package_dir_ = get_out_dir();

  for (const auto & i : NSx) {
    package_dir_ = package_dir_ + "/" + i + "/";
    MKDIR(package_dir_.c_str());
  }

  // Prepare output file for all the types in classmap mode
  if (classmap_) {
    // Make output file
    string f_types_name = package_dir_ + "Types.php";
    f_types_.open(f_types_name.c_str());
    generate_program_header(f_types_);
  }
}